

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widget.c
# Opt level: O1

void text_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  ugui_rect_t *puVar10;
  size_t sVar11;
  ugui_point_t point;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char local_a8 [8];
  uint8_t line_buff [64];
  int local_58;
  ugui_size_t local_40;
  uint local_3c;
  ugui_size_t text_size;
  
  line_buff._56_8_ = graphics_ctx;
  puVar10 = ugui_layer_get_bounds(layer);
  ugui_font_get_text_size(*(font_style_t **)((long)layer_ctx + 8),"A",&local_40);
  uVar7 = local_40.h;
  uVar6 = local_40.w;
  uVar2 = puVar10->w;
  uVar3 = puVar10->h;
  uVar5 = (uint)uVar2 / (uint)local_40.w;
  uVar4 = (uint)local_40.h;
  sVar11 = strlen(*(char **)((long)layer_ctx + 0x18));
  local_3c = (uint)sVar11 & 0xffff;
  if (uVar7 <= uVar3 && (sVar11 & 0xffff) != 0) {
    uVar17 = 0;
    uVar16 = 0;
    uVar15 = 0;
    uVar13 = 0;
    text_size.w = 0;
    text_size.h = 0;
    do {
      uVar14 = (uint)uVar16;
      if (uVar6 <= uVar2) {
        uVar8 = local_3c - uVar14;
        if (local_3c < uVar14) {
          uVar8 = 0;
        }
        uVar12 = 0;
        do {
          if ((sVar11 & 0xffff) <= uVar16 + uVar12) {
            uVar13 = (ulong)uVar8;
            break;
          }
          cVar1 = *(char *)(uVar12 + *(long *)((long)layer_ctx + 0x18) + uVar16);
          if (cVar1 == ' ') {
            uVar13 = uVar12 & 0xffffffff;
          }
          else if (cVar1 == '\n') {
            uVar13 = uVar12 & 0xffffffff;
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar5);
      }
      uVar12 = uVar13 & 0xffff;
      strncpy(local_a8,(char *)(uVar16 + *(long *)((long)layer_ctx + 0x18)),uVar12);
      local_a8[uVar12] = '\0';
      cVar1 = *(char *)((long)layer_ctx + 0x10);
      local_58 = (int)uVar13;
      if (cVar1 == '\x02') {
        text_size = (ugui_size_t)(uVar5 - local_58);
      }
      else if (cVar1 == '\x01') {
        iVar9 = uVar5 - (int)uVar12;
        text_size = (ugui_size_t)((uint)(iVar9 - (iVar9 >> 0x1f)) >> 1);
      }
      else if (cVar1 == '\0') {
        text_size.w = 0;
        text_size.h = 0;
      }
      point.y = (short)uVar15 * local_40.h;
      point.x = local_40.w * text_size.w;
      ugui_graphics_draw_text
                ((ugui_graphics_t *)line_buff._56_8_,local_a8,
                 *(font_style_t **)((long)layer_ctx + 8),point);
      uVar15 = uVar14 + local_58 + 1 & 0xffff;
      uVar16 = (ulong)uVar15;
      if (local_3c <= uVar15) {
        return;
      }
      uVar15 = uVar17 + 1;
      uVar17 = uVar15 & 0xffff;
    } while (uVar17 < uVar3 / uVar4);
  }
  return;
}

Assistant:

static void text_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
    ugui_text_widget_t* text_widget = (ugui_text_widget_t*) layer_ctx;
    ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

    uint8_t line_buff[64];

    ugui_size_t text_size;
    // TODO: dirty hack will only support monospace fonts
    ugui_font_get_text_size(text_widget->font,
                            "A",
                            &text_size);

    uint16_t max_text_width = bounds->w / text_size.w;
    uint16_t max_text_lines = bounds->h / text_size.h;

    uint16_t len = strlen(text_widget->text);

    uint16_t line_index = 0;
    uint16_t line_count = 0;
    uint16_t offset = 0;
    uint16_t alignment_offset = 0;

    while ((offset < len) && (line_index < max_text_lines)) {

        // Determine line length
        for (int i = 0; i < max_text_width; i++) {
            // Handle end of text
            if ((offset + i) >= len) {
                line_count = i;
                break;
            }

            // Handle newlines
            if (text_widget->text[offset + i] == '\n') {
                line_count = i;
                break;
            }

            // Insert linebreaks up to spaces.
            if (text_widget->text[offset + i] == ' ') {
                line_count = i;
            }
        }

        // Copy line into line buffer for rendering
        strncpy(line_buff, text_widget->text + offset, line_count);
        line_buff[line_count] = '\0';

        // Calculate offset for alignment modes
        switch (text_widget->alignment) {
        case UGUI_TEXT_ALIGN_LEFT:
            alignment_offset = 0;
            break;
        case UGUI_TEXT_ALIGN_CENTER:
            alignment_offset = (max_text_width - line_count) / 2;
            break;
        case UGUI_TEXT_ALIGN_RIGHT:
            alignment_offset = (max_text_width - line_count);
            break;
        }

        ugui_graphics_draw_text(graphics_ctx,
                                line_buff,
                                text_widget->font,
        (ugui_point_t) {
            .x = alignment_offset * text_size.w, .y = line_index * text_size.h
        });

        offset += line_count + 1;
        line_index += 1;
    }
}